

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool vkb::detail::GenericFeaturesPNextNode::match
               (GenericFeaturesPNextNode *requested,GenericFeaturesPNextNode *supported)

{
  ulong uVar1;
  bool bVar2;
  
  if (requested->sType != supported->sType) {
    __assert_fail("requested.sType == supported.sType && \"Non-matching sTypes in features nodes!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                  ,0x31,
                  "static bool vkb::detail::GenericFeaturesPNextNode::match(const GenericFeaturesPNextNode &, const GenericFeaturesPNextNode &)"
                 );
  }
  uVar1 = 0;
  bVar2 = false;
  while ((requested->fields[uVar1] == 0 || (supported->fields[uVar1] != 0))) {
    bVar2 = 0xfe < uVar1;
    uVar1 = uVar1 + 1;
    if (uVar1 == 0x100) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool GenericFeaturesPNextNode::match(GenericFeaturesPNextNode const& requested, GenericFeaturesPNextNode const& supported) noexcept {
    assert(requested.sType == supported.sType && "Non-matching sTypes in features nodes!");
    for (uint32_t i = 0; i < field_capacity; i++) {
        if (requested.fields[i] && !supported.fields[i]) return false;
    }
    return true;
}